

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  XmlUnitTestResultPrinter *this_01;
  char *output_file;
  undefined8 uVar2;
  string local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *output_format;
  UnitTestImpl *this_local;
  
  output_format = (string *)this;
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  bVar1 = std::operator==(&local_38,"xml");
  if (bVar1) {
    this_00 = listeners(this);
    this_01 = (XmlUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    output_file = (char *)std::__cxx11::string::c_str();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_01,output_file);
    TestEventListeners::SetDefaultXmlGenerator(this_00,(TestEventListener *)this_01);
    std::__cxx11::string::~string(local_68);
  }
  else {
    bVar1 = std::operator!=(local_18,"");
    if (bVar1) {
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: unrecognized output format \"%s\" ignored.\n",uVar2);
      fflush(_stdout);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    printf("WARNING: unrecognized output format \"%s\" ignored.\n",
           output_format.c_str());
    fflush(stdout);
  }
}